

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O1

void __thiscall
google::protobuf::internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
          (InternalMetadata *this,UnknownFieldSet *other)

{
  pointer pUVar1;
  pointer pUVar2;
  pointer pUVar3;
  UnknownFieldSet *pUVar4;
  
  if (((ulong)this->ptr_ & 1) == 0) {
    pUVar4 = mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this);
  }
  else {
    pUVar4 = (UnknownFieldSet *)(((ulong)this->ptr_ & 0xfffffffffffffffe) + 8);
  }
  pUVar2 = (pUVar4->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pUVar3 = (pUVar4->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pUVar1 = (pUVar4->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pUVar4->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (other->fields_).
       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pUVar4->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (other->fields_).
       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pUVar4->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (other->fields_).
       super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (other->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_start = pUVar2;
  (other->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_finish = pUVar3;
  (other->fields_).
  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pUVar1;
  return;
}

Assistant:

void DoSwap(T* other) {
    mutable_unknown_fields<T>()->Swap(other);
  }